

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O2

long __thiscall DeviceTy::getMapEntryRefCnt(DeviceTy *this,void *HstPtrBegin)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  std::mutex::lock(&this->DataMapMtx);
  p_Var2 = (_List_node_base *)0xffffffffffffffff;
  p_Var1 = (_List_node_base *)&this->HostDataToTargetMap;
  do {
    p_Var1 = (((_List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
              &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)&this->HostDataToTargetMap) goto LAB_00102edc;
  } while ((HstPtrBegin < p_Var1[1]._M_prev) || (p_Var1[2]._M_next <= HstPtrBegin));
  p_Var2 = p_Var1[3]._M_next;
LAB_00102edc:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return (long)p_Var2;
}

Assistant:

long DeviceTy::getMapEntryRefCnt(void *HstPtrBegin) {
  uintptr_t hp = (uintptr_t)HstPtrBegin;
  long RefCnt = -1;

  DataMapMtx.lock();
  for (auto &HT : HostDataToTargetMap) {
    if (hp >= HT.HstPtrBegin && hp < HT.HstPtrEnd) {
      DP("DeviceTy::getMapEntry: requested entry found\n");
      RefCnt = HT.RefCount;
      break;
    }
  }
  DataMapMtx.unlock();

  if (RefCnt < 0) {
    DP("DeviceTy::getMapEntry: requested entry not found\n");
  }

  return RefCnt;
}